

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

void __thiscall
wasm::IRBuilder::fixLoopWithInput(IRBuilder *this,Loop *loop,Type inputType,Index scratch)

{
  Name *pNVar1;
  size_t sVar2;
  char *pcVar3;
  optional<wasm::Type> type;
  Builder *this_00;
  Break *pBVar4;
  Block *pBVar5;
  Break *ret;
  Name name;
  Name name_00;
  string_view sVar6;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  initializer_list<wasm::Expression_*> local_b8;
  _Storage<wasm::Type,_true> local_a8;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  Break *local_98;
  Break *local_90;
  string_view local_88;
  string_view local_78;
  uintptr_t local_68;
  char *local_60;
  size_t local_58;
  _Storage<wasm::Type,_true> local_50;
  Expression *local_48;
  Index local_3c;
  Builder *local_38;
  
  pNVar1 = &loop->name;
  sVar2 = (pNVar1->super_IString).str._M_len;
  pcVar3 = (loop->name).super_IString.str._M_str;
  sVar6 = (pNVar1->super_IString).str;
  local_50 = (_Storage<wasm::Type,_true>)inputType.id;
  local_3c = scratch;
  local_88 = (string_view)makeFresh(this,(Name)(pNVar1->super_IString).str,0);
  local_60 = pcVar3;
  local_58 = sVar2;
  sVar6 = (string_view)makeFresh(this,(Name)sVar6,1);
  local_68 = (loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id;
  local_38 = &this->builder;
  local_48 = loop->body;
  pBVar4 = (Break *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
  (pBVar4->name).super_IString.str._M_len = 0;
  (pBVar4->name).super_IString.str._M_str = (char *)0x0;
  pBVar4->value = (Expression *)0x0;
  pBVar4->condition = (Expression *)0x0;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
  (pBVar4->name).super_IString.str = sVar6;
  local_78 = sVar6;
  if (local_68 == 0) {
    pBVar4->value = (Expression *)0x0;
    pBVar4->condition = (Expression *)0x0;
    Break::finalize(pBVar4);
    local_a8._M_value.id = (Type)(Type)local_50;
    uStack_a0 = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = uStack_9f;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = true;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)local_50;
    name.super_IString.str._M_str = local_60;
    name.super_IString.str._M_len = local_58;
    pBVar5 = Builder::blockifyWithName(local_38,local_48,name,(Expression *)pBVar4,type);
  }
  else {
    pBVar4->value = local_48;
    pBVar4->condition = (Expression *)0x0;
    Break::finalize(pBVar4);
    local_b8._M_array = (iterator)&local_98;
    local_b8._M_len = 1;
    name_00.super_IString.str._M_str = local_60;
    name_00.super_IString.str._M_len = local_58;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)local_50;
    local_98 = pBVar4;
    pBVar5 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (local_38,name_00,&local_b8,type_00);
  }
  this_00 = local_38;
  local_98 = (Break *)Builder::makeLocalSet(local_38,local_3c,(Expression *)pBVar5);
  pBVar4 = (Break *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x30,8);
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
  (pBVar4->name).super_IString.str._M_len = 0;
  (pBVar4->name).super_IString.str._M_str = (char *)0x0;
  pBVar4->value = (Expression *)0x0;
  pBVar4->condition = (Expression *)0x0;
  (pBVar4->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
  sVar2 = local_88._M_len;
  (pBVar4->name).super_IString.str._M_len = local_88._M_len;
  pcVar3 = local_88._M_str;
  (pBVar4->name).super_IString.str._M_str = local_88._M_str;
  pBVar4->value = (Expression *)0x0;
  pBVar4->condition = (Expression *)0x0;
  Break::finalize(pBVar4);
  local_b8._M_array = (iterator)&local_98;
  local_b8._M_len = 2;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 1;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       (_Storage<wasm::Type,_true>)
       (loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id;
  local_90 = pBVar4;
  pBVar5 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                     (this_00,(Name)local_78,&local_b8,type_01);
  loop->body = (Expression *)pBVar5;
  (loop->name).super_IString.str._M_len = sVar2;
  (loop->name).super_IString.str._M_str = pcVar3;
  return;
}

Assistant:

void IRBuilder::fixLoopWithInput(Loop* loop, Type inputType, Index scratch) {
  auto l = loop->name;
  auto l0 = makeFresh(l, 0);
  auto l1 = makeFresh(l, 1);

  Block* inner =
    loop->type == Type::none
      ? builder.blockifyWithName(
          loop->body, l, builder.makeBreak(l1), inputType)
      : builder.makeBlock(l, {builder.makeBreak(l1, loop->body)}, inputType);

  Block* outer = builder.makeBlock(
    l1,
    {builder.makeLocalSet(scratch, inner), builder.makeBreak(l0)},
    loop->type);

  loop->body = outer;
  loop->name = l0;
}